

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbiw__outfile(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,
                  void *data,int alpha,int pad,char *fmt,...)

{
  char in_AL;
  int iVar1;
  void *pvVar2;
  int iVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  stbiw_uint32 zero;
  long local_138;
  long local_130;
  ulong local_128;
  ulong local_120;
  void *local_118;
  ulong local_110;
  va_list v;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  uVar4 = (undefined4)((ulong)_comp >> 0x20);
  iVar1 = (int)_comp;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((y | x) < 0) {
    iVar1 = 0;
  }
  else {
    v[0].reg_save_area = local_e8;
    v[0].overflow_arg_area = &stack0x00000030;
    v[0].gp_offset = 0x30;
    v[0].fp_offset = 0x30;
    iVar3 = iVar1;
    stbiw__writefv(s,fmt,v);
    zero = 0;
    if (0 < y) {
      local_128 = 0;
      local_130 = (ulong)(stbi__flip_vertically_on_write != 0) * 2 + -1;
      local_110 = (ulong)(y - 1);
      if (stbi__flip_vertically_on_write != 0) {
        local_110 = local_128;
      }
      if (0 < x) {
        local_128 = (ulong)(uint)x;
      }
      local_120 = (ulong)(int)(-(uint)(stbi__flip_vertically_on_write == 0) | y);
      local_138 = (long)x * (long)iVar1;
      pvVar2 = (void *)(local_138 * local_110 + (long)data);
      local_138 = local_138 * local_130;
      for (; uVar5 = local_128, local_118 = pvVar2, local_110 != local_120;
          local_110 = local_110 + local_130) {
        while (uVar5 != 0) {
          stbiw__write_pixel(s,iVar1,alpha,expand_mono,(int)pvVar2,(uchar *)CONCAT44(uVar4,iVar3));
          pvVar2 = (void *)((long)pvVar2 + (long)iVar1);
          uVar5 = uVar5 - 1;
        }
        (*s->func)(s->context,&zero,pad);
        pvVar2 = (void *)((long)local_118 + local_138);
      }
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbiw__outfile(stbi__write_context *s, int rgb_dir, int vdir, int x, int y, int comp, int expand_mono, void *data, int alpha, int pad, const char *fmt, ...)
{
   if (y < 0 || x < 0) {
      return 0;
   } else {
      va_list v;
      va_start(v, fmt);
      stbiw__writefv(s, fmt, v);
      va_end(v);
      stbiw__write_pixels(s,rgb_dir,vdir,x,y,comp,data,alpha,pad, expand_mono);
      return 1;
   }
}